

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

bool __thiscall GlobOpt::DoCSE(GlobOpt *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  GlobOpt *this_local;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,CSEPhase,uVar2,uVar3);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = IsLoopPrePass(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = Func::GetSourceContextId(this->func);
      uVar3 = Func::GetLocalFunctionId(this->func);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,CSEPhase,uVar2,uVar3);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = DoFieldOpts(this,this->currentBlock->loop);
        if ((!bVar1) && (bVar1 = GetIsAsmJSFunc(this), !bVar1)) {
          return false;
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::DoCSE()
{
    if (PHASE_OFF(Js::CSEPhase, this->func))
    {
        return false;
    }
    if (this->IsLoopPrePass())
    {
        return false;
    }

    if (PHASE_FORCE(Js::CSEPhase, this->func))
    {
        // Force always turn it on
        return true;
    }

    if (!this->DoFieldOpts(this->currentBlock->loop) && !GetIsAsmJSFunc())
    {
        return false;
    }

    return true;
}